

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O0

void __thiscall so_5::environment_t::impl__run_stats_controller_and_go_further(environment_t *this)

{
  anon_class_8_1_8991fb9c local_60;
  anon_class_8_1_8991fb9c local_58;
  anon_class_8_1_8991fb9c local_50 [3];
  allocator local_31;
  string local_30 [32];
  environment_t *local_10;
  environment_t *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"run_stats_controller",&local_31);
  local_60.this = this;
  local_58.this = this;
  local_50[0].this = this;
  so_5::impl::
  run_stage<so_5::environment_t::impl__run_stats_controller_and_go_further()::__0,so_5::environment_t::impl__run_stats_controller_and_go_further()::__1,so_5::environment_t::impl__run_stats_controller_and_go_further()::__2>
            ((string *)local_30,local_50,&local_58,&local_60);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void
environment_t::impl__run_stats_controller_and_go_further()
{
	impl::run_stage(
			"run_stats_controller",
			[this] {
				/* there is no need to turn_on controller automatically */
			},
			[this] { m_impl->m_infrastructure->stats_controller().turn_off(); },
			[this] { impl__run_layers_and_go_further(); } );
}